

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O3

uint32_t snestistics::instruction_size(uint8_t opcode,bool acc16,bool ind16)

{
  int iVar1;
  long lVar2;
  undefined3 in_register_00000039;
  
  iVar1 = *(int *)(opCodeInfo + (ulong)CONCAT31(in_register_00000039,opcode) * 0x18 + 0x10);
  lVar2 = (long)iVar1;
  if ((((lVar2 != 2 || ind16) && (lVar2 != 1 || acc16)) && (((opcode & 0xfd) != 0 || (iVar1 != 3))))
     && ((iVar1 != 4 || ((&branches)[CONCAT31(in_register_00000039,opcode)] == '\0')))) {
    return *(uint32_t *)(g_oplut + lVar2 * 0x20 + 4);
  }
  return 2;
}

Assistant:

uint32_t instruction_size(const uint8_t opcode, const bool acc16, const bool ind16) {
	const int am = opCodeInfo[opcode].adressMode;
	const AdressModeInfo &ami = g_oplut[am];

	// We have a few special cases that doesn't work with our simple table
	if (am == 1 && !acc16) {
		return 2;
	} else if (am == 2 && !ind16) {
		return 2;
	} else if (am == 3 && (opcode == 0 || opcode == 2)) {
		return 2;
	} else if (am == 4 && branches[opcode]) { // NOTE: BRL has am == 5
		return 2;
	} else {
		return ami.numBytes;
	}
}